

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsRandomShaderProgram.cpp
# Opt level: O3

void __thiscall
deqp::gls::RandomShaderProgram::RandomShaderProgram
          (RandomShaderProgram *this,Shader *vertexShader,Shader *fragmentShader,
          int numUnifiedUniforms,ShaderInput **unifiedUniforms)

{
  _Rb_tree_header *p_Var1;
  pointer *pppVVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  ShaderInput *pSVar4;
  iterator __position;
  Shader *pSVar5;
  DataType scalarType;
  Type TVar6;
  ShaderProgramDeclaration *this_00;
  Variable *pVVar7;
  InternalError *pIVar8;
  uint uVar9;
  ulong uVar10;
  GenericVecType GVar11;
  Variable *pVVar12;
  pointer ppSVar13;
  Variable *vertexOutput;
  allocator<char> local_1ea;
  allocator<char> local_1e9;
  VertexAttribute local_1e8;
  long *local_1c0;
  long local_1b8;
  long local_1b0 [2];
  Sampler2DMap *local_1a0;
  Shader *local_198;
  Shader *local_190;
  FragmentSource local_188;
  long *local_168;
  long local_160;
  long local_158 [2];
  ShaderProgramDeclaration local_148;
  
  local_1a0 = (Sampler2DMap *)unifiedUniforms;
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_148);
  local_190 = vertexShader;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,(vertexShader->m_source)._M_dataplus._M_p,&local_1e9);
  local_1e8.name._M_dataplus._M_p = (pointer)&local_1e8.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,local_1c0,local_1b8 + (long)local_1c0);
  this_00 = sglr::pdec::ShaderProgramDeclaration::operator<<(&local_148,(VertexSource *)&local_1e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_168,(fragmentShader->m_source)._M_dataplus._M_p,&local_1ea);
  paVar3 = &local_188.source.field_2;
  local_188.source._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_188,local_168,local_160 + (long)local_168);
  sglr::pdec::ShaderProgramDeclaration::operator<<(this_00,&local_188);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188.source._M_dataplus._M_p != paVar3) {
    operator_delete(local_188.source._M_dataplus._M_p,
                    local_188.source.field_2._M_allocated_capacity + 1);
  }
  if (local_168 != local_158) {
    operator_delete(local_168,local_158[0] + 1);
  }
  local_198 = fragmentShader;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8.name._M_dataplus._M_p != &local_1e8.name.field_2) {
    operator_delete(local_1e8.name._M_dataplus._M_p,local_1e8.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0,local_1b0[0] + 1);
  }
  ppSVar13 = (local_190->m_inputs).
             super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppSVar13 !=
      (local_190->m_inputs).
      super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      pSVar4 = *ppSVar13;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c0,(pSVar4->m_variable->m_name)._M_dataplus._M_p,
                 (allocator<char> *)&local_188);
      TVar6 = (pSVar4->m_variable->m_type).m_baseType;
      local_1e8.name._M_dataplus._M_p = (pointer)&local_1e8.name.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1e8,local_1c0,local_1b8 + (long)local_1c0);
      local_1e8.type = TVar6 == TYPE_INT ^ GENERICVECTYPE_LAST;
      if (TVar6 == TYPE_FLOAT) {
        local_1e8.type = GENERICVECTYPE_FLOAT;
      }
      sglr::pdec::ShaderProgramDeclaration::operator<<(&local_148,&local_1e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8.name._M_dataplus._M_p != &local_1e8.name.field_2) {
        operator_delete(local_1e8.name._M_dataplus._M_p,
                        local_1e8.name.field_2._M_allocated_capacity + 1);
      }
      if (local_1c0 != local_1b0) {
        operator_delete(local_1c0,local_1b0[0] + 1);
      }
      ppSVar13 = ppSVar13 + 1;
    } while (ppSVar13 !=
             (local_190->m_inputs).
             super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  pSVar5 = local_198;
  ppSVar13 = (local_198->m_inputs).
             super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppSVar13 !=
      (local_198->m_inputs).
      super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      TVar6 = ((*ppSVar13)->m_variable->m_type).m_baseType;
      uVar9 = TVar6 == TYPE_INT ^ 3;
      if (TVar6 == TYPE_FLOAT) {
        uVar9 = 0;
      }
      local_1e8.name._M_dataplus._M_p._0_5_ = (uint5)uVar9;
      sglr::pdec::ShaderProgramDeclaration::operator<<
                (&local_148,(VertexToFragmentVarying *)&local_1e8);
      ppSVar13 = ppSVar13 + 1;
    } while (ppSVar13 !=
             (pSVar5->m_inputs).
             super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (0 < numUnifiedUniforms) {
    uVar10 = 0;
    do {
      pSVar4 = *(ShaderInput **)((long)local_1a0 + uVar10 * 8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c0,(pSVar4->m_variable->m_name)._M_dataplus._M_p,
                 (allocator<char> *)&local_188);
      pVVar7 = pSVar4->m_variable;
      TVar6 = (pVVar7->m_type).m_baseType;
      if (TVar6 - TYPE_FLOAT < 6) {
        switch(TVar6) {
        case TYPE_FLOAT:
          break;
        case TYPE_INT:
          TVar6 = 0x1b;
          break;
        case TYPE_BOOL:
          TVar6 = 0x23;
          break;
        default:
          goto switchD_00980e3d_caseD_4;
        case TYPE_SAMPLER_2D:
          GVar11 = 0x28;
          goto LAB_00980e6e;
        }
        GVar11 = ((pVVar7->m_type).m_numElements + TVar6) - GENERICVECTYPE_UINT32;
      }
      else {
switchD_00980e3d_caseD_4:
        GVar11 = 0x5e;
        if (TVar6 == TYPE_SAMPLER_CUBE) {
          GVar11 = 0x29;
        }
      }
LAB_00980e6e:
      local_1e8.name._M_dataplus._M_p = (pointer)&local_1e8.name.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1e8,local_1c0,local_1b8 + (long)local_1c0);
      local_1e8.type = GVar11;
      sglr::pdec::ShaderProgramDeclaration::operator<<(&local_148,(Uniform *)&local_1e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8.name._M_dataplus._M_p != &local_1e8.name.field_2) {
        operator_delete(local_1e8.name._M_dataplus._M_p,
                        local_1e8.name.field_2._M_allocated_capacity + 1);
      }
      if (local_1c0 != local_1b0) {
        operator_delete(local_1c0,local_1b0[0] + 1);
      }
      uVar10 = uVar10 + 1;
    } while ((uint)numUnifiedUniforms != uVar10);
  }
  local_1e8.name._M_dataplus._M_p = local_1e8.name._M_dataplus._M_p & 0xffffffff00000000;
  sglr::pdec::ShaderProgramDeclaration::operator<<(&local_148,(FragmentOutput *)&local_1e8);
  sglr::ShaderProgram::ShaderProgram(&this->super_ShaderProgram,&local_148);
  pSVar5 = local_198;
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_148);
  (this->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_00d2e2e0;
  (this->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_00d2e318;
  (this->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_00d2e330;
  this->m_vertexShader = local_190;
  this->m_fragmentShader = pSVar5;
  this->m_numUnifiedUniforms = numUnifiedUniforms;
  this->m_unifiedUniforms = (ShaderInput **)local_1a0;
  pVVar7 = findShaderOutputByName(local_190,"gl_Position");
  this->m_positionVar = pVVar7;
  (this->m_vertexOutputs).
  super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vertexOutputs).
  super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vertexOutputs).
  super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.m_vertexAttributes.
  super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.m_vertexAttributes.
  super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.m_vertexAttributes.
  super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  rsg::Shader::getOutputs
            (pSVar5,(vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_> *)
                    &local_148);
  for (pVVar7 = (Variable *)
                local_148.m_vertexAttributes.
                super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pVVar7 != (Variable *)
                local_148.m_vertexAttributes.
                super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pVVar7 = (Variable *)&(pVVar7->m_type).m_typeName) {
    pVVar12 = *(Variable **)&pVVar7->m_type;
    if (pVVar12->m_layoutLocation == 0) goto LAB_00980fde;
  }
  pVVar12 = (Variable *)0x0;
LAB_00980fde:
  if ((Variable *)
      local_148.m_vertexAttributes.
      super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>.
      _M_impl.super__Vector_impl_data._M_start != (Variable *)0x0) {
    operator_delete(local_148.m_vertexAttributes.
                    super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_148.m_vertexAttributes.
                          super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.m_vertexAttributes.
                          super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  this->m_fragColorVar = pVVar12;
  local_1a0 = &this->m_sampler2DMap;
  p_Var1 = &(this->m_sampler2DMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_sampler2DMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_sampler2DMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_sampler2DMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_sampler2DMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_sampler2DMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_samplerCubeMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_samplerCubeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_samplerCubeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_samplerCubeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->m_samplerCubeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_samplerCubeMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  rsg::ExecutionContext::ExecutionContext(&this->m_execCtx,local_1a0,&this->m_samplerCubeMap);
  pVVar7 = this->m_positionVar;
  if (((pVVar7 == (Variable *)0x0) || ((pVVar7->m_type).m_baseType != TYPE_FLOAT)) ||
     ((pVVar7->m_type).m_numElements != 4)) {
    pIVar8 = (InternalError *)__cxa_allocate_exception(0x38);
    tcu::InternalError::InternalError
              (pIVar8,(char *)0x0,
               "m_positionVar && m_positionVar->getType().getBaseType() == rsg::VariableType::TYPE_FLOAT && m_positionVar->getType().getNumElements() == 4"
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderProgram.cpp"
               ,0x8d);
  }
  else {
    pVVar7 = this->m_fragColorVar;
    if (((pVVar7 != (Variable *)0x0) && ((pVVar7->m_type).m_baseType == TYPE_FLOAT)) &&
       ((pVVar7->m_type).m_numElements == 4)) {
      ppSVar13 = (local_198->m_inputs).
                 super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl
                 .super__Vector_impl_data._M_start;
      if (ppSVar13 !=
          (local_198->m_inputs).
          super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          local_148.m_vertexAttributes.
          super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)findShaderOutputByName
                                  (local_190,((*ppSVar13)->m_variable->m_name)._M_dataplus._M_p);
          if ((Variable *)
              local_148.m_vertexAttributes.
              super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>
              ._M_impl.super__Vector_impl_data._M_start == (Variable *)0x0) {
            pIVar8 = (InternalError *)__cxa_allocate_exception(0x38);
            tcu::InternalError::InternalError
                      (pIVar8,(char *)0x0,"vertexOutput",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderProgram.cpp"
                       ,0x96);
            __cxa_throw(pIVar8,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
          }
          __position._M_current =
               (this->m_vertexOutputs).
               super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->m_vertexOutputs).
              super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<rsg::Variable_const*,std::allocator<rsg::Variable_const*>>::
            _M_realloc_insert<rsg::Variable_const*const&>
                      ((vector<rsg::Variable_const*,std::allocator<rsg::Variable_const*>> *)
                       &this->m_vertexOutputs,__position,(Variable **)&local_148);
          }
          else {
            *__position._M_current =
                 (Variable *)
                 local_148.m_vertexAttributes.
                 super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            pppVVar2 = &(this->m_vertexOutputs).
                        super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppVVar2 = *pppVVar2 + 1;
          }
          ppSVar13 = ppSVar13 + 1;
        } while (ppSVar13 !=
                 (local_198->m_inputs).
                 super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl
                 .super__Vector_impl_data._M_finish);
      }
      return;
    }
    pIVar8 = (InternalError *)__cxa_allocate_exception(0x38);
    tcu::InternalError::InternalError
              (pIVar8,(char *)0x0,
               "m_fragColorVar && m_fragColorVar->getType().getBaseType() == rsg::VariableType::TYPE_FLOAT && m_fragColorVar->getType().getNumElements() == 4"
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderProgram.cpp"
               ,0x8e);
  }
  __cxa_throw(pIVar8,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

RandomShaderProgram::RandomShaderProgram (const rsg::Shader& vertexShader, const rsg::Shader& fragmentShader, int numUnifiedUniforms, const rsg::ShaderInput* const* unifiedUniforms)
	: sglr::ShaderProgram	(generateProgramDeclaration(vertexShader, fragmentShader, numUnifiedUniforms, unifiedUniforms))
	, m_vertexShader		(vertexShader)
	, m_fragmentShader		(fragmentShader)
	, m_numUnifiedUniforms	(numUnifiedUniforms)
	, m_unifiedUniforms		(unifiedUniforms)
	, m_positionVar			(findShaderOutputByName(vertexShader, "gl_Position"))
	, m_fragColorVar		(findShaderOutputByLocation(fragmentShader, 0))
	, m_execCtx				(m_sampler2DMap, m_samplerCubeMap)
{
	TCU_CHECK_INTERNAL(m_positionVar && m_positionVar->getType().getBaseType() == rsg::VariableType::TYPE_FLOAT && m_positionVar->getType().getNumElements() == 4);
	TCU_CHECK_INTERNAL(m_fragColorVar && m_fragColorVar->getType().getBaseType() == rsg::VariableType::TYPE_FLOAT && m_fragColorVar->getType().getNumElements() == 4);

	// Build list of vertex outputs.
	for (vector<rsg::ShaderInput*>::const_iterator fragInIter = fragmentShader.getInputs().begin(); fragInIter != fragmentShader.getInputs().end(); ++fragInIter)
	{
		const rsg::ShaderInput*	fragInput		= *fragInIter;
		const rsg::Variable*	vertexOutput	= findShaderOutputByName(vertexShader, fragInput->getVariable()->getName());

		TCU_CHECK_INTERNAL(vertexOutput);
		m_vertexOutputs.push_back(vertexOutput);
	}
}